

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O3

void helics::valueExtract(data_view *data,DataType baseType,char *val)

{
  double dVar1;
  string_view val_00;
  undefined8 uVar2;
  char cVar3;
  invalid_argument *this;
  ulong uVar4;
  double *pdVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  string_view val_01;
  long val_1;
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  undefined8 local_28;
  __index_type local_20;
  
  if (0x1d < baseType) {
    if (baseType == HELICS_JSON) {
      readJsonValue_abi_cxx11_((defV *)local_48,(helics *)data,(data_view *)val);
      valueExtract((defV *)local_48,val);
LAB_002022db:
      std::__detail::__variant::
      _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)local_48);
      return;
    }
    if (baseType == HELICS_ANY) {
      local_48[0] = '\0';
      local_48._1_7_ = 0;
      local_20 = '\0';
      valueExtract(data,HELICS_ANY,(defV *)local_48);
      valueExtract((defV *)local_48,val);
      goto LAB_002022db;
    }
    if (baseType == HELICS_MULTI) goto LAB_00202466;
LAB_0020241b:
    local_48[0] = 0;
    local_48._1_7_ = 0;
    local_48._8_8_ = (char *)0x0;
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(string_view *)local_48);
    uVar2 = local_48._8_8_;
    val_00._M_len._1_7_ = local_48._1_7_;
    val_00._M_len._0_1_ = local_48[0];
    val_00._M_str = (char *)local_48._8_8_;
    if (CONCAT71(local_48._1_7_,local_48[0]) != 1) {
      dVar1 = getDoubleFromString(val_00);
      uVar6 = SUB84(dVar1,0);
      uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
      if ((dVar1 != -1e+49) || (NAN(dVar1))) goto LAB_00202454;
    }
    cVar3 = *(char *)uVar2;
LAB_0020245d:
    *val = cVar3;
    return;
  }
  switch(baseType) {
  case HELICS_DOUBLE:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(double *)local_48);
    cVar3 = (char)(int)(double)CONCAT71(local_48._1_7_,local_48[0]);
    goto LAB_0020245d;
  case HELICS_INT:
  case HELICS_TIME:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(int64_t *)local_48);
    goto LAB_00202387;
  case HELICS_COMPLEX:
    local_48[0] = 0;
    local_48._1_7_ = 0;
    local_48._8_8_ = 0.0;
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(complex<double> *)local_48);
    uVar6 = (undefined4)CONCAT71(local_48._1_7_,local_48[0]);
    uVar7 = SUB74(local_48._1_7_,3);
    if (((double)local_48._8_8_ != 0.0) || (NAN((double)local_48._8_8_))) {
      dVar1 = cabs((double)CONCAT71(local_48._1_7_,local_48[0]));
      uVar6 = SUB84(dVar1,0);
      uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
    }
LAB_00202454:
    cVar3 = (char)(int)(double)CONCAT44(uVar7,uVar6);
    goto LAB_0020245d;
  case HELICS_VECTOR:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
              ((vector<double,_std::allocator<double>_> *)local_48,data);
    pdVar5 = (double *)CONCAT71(local_48._1_7_,local_48[0]);
    if (local_48._8_8_ - (long)pdVar5 != 8) {
      dVar1 = vectorNorm((vector<double,_std::allocator<double>_> *)local_48);
      pdVar5 = (double *)CONCAT71(local_48._1_7_,local_48[0]);
      *val = (char)(int)dVar1;
      goto LAB_002024be;
    }
    *val = (char)(int)*pdVar5;
    break;
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_48,data)
    ;
    pdVar5 = (double *)CONCAT71(local_48._1_7_,local_48[0]);
    if (local_48._8_8_ - (long)pdVar5 == 0x10) {
      dVar1 = *pdVar5;
      uVar6 = SUB84(dVar1,0);
      uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
      if ((pdVar5[1] != 0.0) || (NAN(pdVar5[1]))) {
        dVar1 = cabs(dVar1);
        uVar6 = SUB84(dVar1,0);
        uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
      }
    }
    else {
      dVar1 = vectorNorm((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                         local_48);
      uVar6 = SUB84(dVar1,0);
      uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    *val = (char)(int)(double)CONCAT44(uVar7,uVar6);
    pdVar5 = (double *)CONCAT71(local_48._1_7_,local_48[0]);
LAB_002024be:
    if (pdVar5 == (double *)0x0) {
      return;
    }
    break;
  case HELICS_NAMED_POINT:
    ValueConverter<helics::NamedPoint>::interpret((NamedPoint *)local_48,data);
    uVar6 = (undefined4)local_28;
    uVar7 = (undefined4)((ulong)local_28 >> 0x20);
    if (NAN((double)local_28)) {
      if (local_48._8_8_ == 1) {
        cVar3 = *(char *)CONCAT71(local_48._1_7_,local_48[0]);
      }
      else {
        val_01._M_str = (char *)CONCAT71(local_48._1_7_,local_48[0]);
        val_01._M_len = local_48._8_8_;
        dVar1 = getDoubleFromString(val_01);
        uVar6 = SUB84(dVar1,0);
        uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
        if ((dVar1 != -1e+49) || (NAN(dVar1))) goto LAB_002023f1;
        cVar3 = *(char *)CONCAT71(local_48._1_7_,local_48[0]);
      }
    }
    else {
LAB_002023f1:
      cVar3 = (char)(int)(double)CONCAT44(uVar7,uVar6);
    }
    *val = cVar3;
    pdVar5 = (double *)CONCAT71(local_48._1_7_,local_48[0]);
    if (pdVar5 == (double *)(local_48 + 0x10)) {
      return;
    }
    uVar4 = local_38._M_allocated_capacity + 1;
    goto LAB_002024cb;
  case HELICS_BOOL:
    local_48[0] = 0;
    local_48._1_7_ = 0;
    local_48._8_8_ = (char *)0x0;
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(string_view *)local_48);
    local_48[0] = *(undefined1 *)local_48._8_8_;
LAB_00202387:
    *val = local_48[0];
    return;
  default:
    if (baseType == HELICS_CUSTOM) {
LAB_00202466:
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"unrecognized helics type");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    goto LAB_0020241b;
  }
  uVar4 = local_38._M_allocated_capacity - (long)pdVar5;
LAB_002024cb:
  operator_delete(pdVar5,uVar4);
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, char& val)
{
    switch (baseType) {
        case DataType::HELICS_ANY: {
            defV val_dv;
            valueExtract(data, baseType, val_dv);
            valueExtract(val_dv, val);
            break;
        }
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            auto value = ValueConverter<std::string_view>::interpret(data);
            if (value.size() == 1) {
                val = value[0];
            } else {
                const double dval = getDoubleFromString(value);
                if (dval != invalidDouble) {
                    val = static_cast<char>(dval);
                } else {
                    val = value[0];
                }
            }
        }

        break;
        case DataType::HELICS_BOOL:
            val = ValueConverter<std::string_view>::interpret(data)[0];
            break;
        case DataType::HELICS_NAMED_POINT: {
            auto npval = ValueConverter<NamedPoint>::interpret(data);
            if (std::isnan(npval.value)) {
                if (npval.name.size() == 1) {
                    val = npval.name[0];
                } else {
                    const double value = getDoubleFromString(npval.name);
                    if (value != invalidDouble) {
                        val = static_cast<char>(value);
                    } else {
                        val = npval.name[0];
                    }
                }
            } else {
                val = static_cast<char>(npval.value);
            }
            break;
        }
        case DataType::HELICS_DOUBLE: {
            val = static_cast<char>(ValueConverter<double>::interpret(data));
            break;
        }
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME: {
            auto intVal = ValueConverter<int64_t>::interpret(data);
            val = static_cast<char>(intVal);
            break;
        }

        case DataType::HELICS_VECTOR: {
            auto vec = ValueConverter<std::vector<double>>::interpret(data);
            val = static_cast<char>((vec.size() == 1) ? vec[0] : vectorNorm(vec));
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto cval = ValueConverter<std::complex<double>>::interpret(data);
            val = static_cast<char>((cval.imag() == 0.0) ? cval.real() : std::abs(cval));
            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto cvec = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            val = static_cast<char>(
                (cvec.size() == 1) ?
                    ((cvec[0].imag() == 0.0) ? cvec[0].real() : std::abs(cvec[0])) :
                    vectorNorm(cvec));
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
        case DataType::HELICS_CUSTOM:
        case DataType::HELICS_MULTI:
            throw(std::invalid_argument("unrecognized helics type"));
    }
}